

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O1

bool nlohmann::json_abi_v3_11_3::operator==(const_reference lhs,const_reference rhs)

{
  number_integer_t nVar1;
  value_t vVar2;
  value_t vVar3;
  array_t *paVar4;
  const_reference pvVar5;
  string_t *psVar6;
  array_t *paVar7;
  pointer __n;
  object_t *poVar8;
  object_t *poVar9;
  double dVar10;
  bool bVar11;
  bool bVar12;
  int iVar13;
  const_reference lhs_00;
  const_reference rhs_00;
  tuple<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_const_unsigned_long_&,_const_bool_&>
  local_50;
  tuple<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_const_unsigned_long_&,_const_bool_&>
  local_38;
  
  vVar2 = (lhs->m_data).m_type;
  vVar3 = (rhs->m_data).m_type;
  if (vVar2 != vVar3) {
    if (vVar2 == number_integer && (vVar3 ^ number_float) == null) {
      bVar12 = (double)(lhs->m_data).m_value.number_integer == (rhs->m_data).m_value.number_float;
      goto LAB_001557c1;
    }
    if (vVar2 != number_float || (vVar3 ^ number_integer) != null) {
      if (vVar2 == number_unsigned && (vVar3 ^ number_float) == null) {
        nVar1 = (lhs->m_data).m_value.number_integer;
        bVar12 = ((double)CONCAT44(0x45300000,(int)((ulong)nVar1 >> 0x20)) - 1.9342813113834067e+25)
                 + ((double)CONCAT44(0x43300000,(int)nVar1) - 4503599627370496.0) ==
                 (rhs->m_data).m_value.number_float;
      }
      else {
        if (vVar2 != number_float || (vVar3 ^ number_unsigned) != null) {
          if ((vVar2 != number_unsigned || (vVar3 ^ number_integer) != null) &&
             (vVar2 != number_integer || (vVar3 ^ number_unsigned) != null)) {
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::compares_unordered(lhs,rhs,false);
            return false;
          }
          goto switchD_001556e5_caseD_5;
        }
        nVar1 = (rhs->m_data).m_value.number_integer;
        bVar12 = ((double)CONCAT44(0x45300000,(int)((ulong)nVar1 >> 0x20)) - 1.9342813113834067e+25)
                 + ((double)CONCAT44(0x43300000,(int)nVar1) - 4503599627370496.0) ==
                 (lhs->m_data).m_value.number_float;
      }
      goto LAB_001557c1;
    }
    dVar10 = (double)(rhs->m_data).m_value.number_integer;
LAB_001557b6:
    bVar12 = dVar10 == (lhs->m_data).m_value.number_float;
LAB_001557c1:
    return (bool)(-bVar12 & 1);
  }
  bVar12 = true;
  switch(vVar2) {
  case null:
    goto switchD_001556e5_caseD_0;
  case object:
    poVar8 = (lhs->m_data).m_value.object;
    poVar9 = (rhs->m_data).m_value.object;
    if ((poVar8->_M_t)._M_impl.super__Rb_tree_header._M_node_count ==
        (poVar9->_M_t)._M_impl.super__Rb_tree_header._M_node_count) {
      bVar12 = std::__equal<false>::
               equal<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                         ((poVar8->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
                          (_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                           )&(poVar8->_M_t)._M_impl.super__Rb_tree_header,
                          (poVar9->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left);
      return bVar12;
    }
    break;
  case array:
    paVar7 = (lhs->m_data).m_value.array;
    paVar4 = (rhs->m_data).m_value.array;
    lhs_00 = (paVar7->
             super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pvVar5 = (paVar7->
             super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    rhs_00 = (paVar4->
             super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((long)pvVar5 - (long)lhs_00 ==
        (long)(paVar4->
              super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
              )._M_impl.super__Vector_impl_data._M_finish - (long)rhs_00) {
      bVar12 = lhs_00 == pvVar5;
      if (bVar12) {
        return bVar12;
      }
      bVar11 = operator==(lhs_00,rhs_00);
      if (!bVar11) {
        return bVar12;
      }
      do {
        rhs_00 = rhs_00 + 1;
        lhs_00 = lhs_00 + 1;
        bVar12 = lhs_00 == pvVar5;
        if (bVar12) {
          return bVar12;
        }
        bVar11 = operator==(lhs_00,rhs_00);
      } while (bVar11);
      return bVar12;
    }
    break;
  case string:
    psVar6 = (lhs->m_data).m_value.string;
    paVar7 = (rhs->m_data).m_value.array;
    __n = (pointer)psVar6->_M_string_length;
    if (__n == (paVar7->
               super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
               )._M_impl.super__Vector_impl_data._M_finish) {
      if (__n == (pointer)0x0) {
        return true;
      }
      iVar13 = bcmp((psVar6->_M_dataplus)._M_p,
                    (paVar7->
                    super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                    )._M_impl.super__Vector_impl_data._M_start,(size_t)__n);
      return iVar13 == 0;
    }
    break;
  case boolean:
    return (lhs->m_data).m_value.boolean == (rhs->m_data).m_value.boolean;
  case number_integer:
  case number_unsigned:
switchD_001556e5_caseD_5:
    return (lhs->m_data).m_value.object == (rhs->m_data).m_value.object;
  case number_float:
    dVar10 = (rhs->m_data).m_value.number_float;
    goto LAB_001557b6;
  case binary:
    local_38.
    super__Tuple_impl<0UL,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_const_unsigned_long_&,_const_bool_&>
    .
    super__Head_base<0UL,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_false>
    ._M_head_impl =
         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(lhs->m_data).m_value.object;
    local_50.
    super__Tuple_impl<0UL,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_const_unsigned_long_&,_const_bool_&>
    .
    super__Head_base<0UL,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_false>
    ._M_head_impl =
         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(rhs->m_data).m_value.object;
    local_38.
    super__Tuple_impl<0UL,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_const_unsigned_long_&,_const_bool_&>
    .super__Tuple_impl<1UL,_const_unsigned_long_&,_const_bool_&>.
    super__Head_base<1UL,_const_unsigned_long_&,_false>._M_head_impl =
         (unsigned_long *)
         &(((object_t *)
           local_38.
           super__Tuple_impl<0UL,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_const_unsigned_long_&,_const_bool_&>
           .
           super__Head_base<0UL,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_false>
           ._M_head_impl)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    local_38.
    super__Tuple_impl<0UL,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_const_unsigned_long_&,_const_bool_&>
    .super__Tuple_impl<1UL,_const_unsigned_long_&,_const_bool_&>.
    super__Tuple_impl<2UL,_const_bool_&>.super__Head_base<2UL,_const_bool_&,_false>._M_head_impl =
         (_Head_base<2UL,_const_bool_&,_false>)
         &(((object_t *)
           local_38.
           super__Tuple_impl<0UL,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_const_unsigned_long_&,_const_bool_&>
           .
           super__Head_base<0UL,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_false>
           ._M_head_impl)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right;
    local_50.
    super__Tuple_impl<0UL,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_const_unsigned_long_&,_const_bool_&>
    .super__Tuple_impl<1UL,_const_unsigned_long_&,_const_bool_&>.
    super__Head_base<1UL,_const_unsigned_long_&,_false>._M_head_impl =
         (unsigned_long *)
         &(((object_t *)
           local_50.
           super__Tuple_impl<0UL,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_const_unsigned_long_&,_const_bool_&>
           .
           super__Head_base<0UL,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_false>
           ._M_head_impl)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    local_50.
    super__Tuple_impl<0UL,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_const_unsigned_long_&,_const_bool_&>
    .super__Tuple_impl<1UL,_const_unsigned_long_&,_const_bool_&>.
    super__Tuple_impl<2UL,_const_bool_&>.super__Head_base<2UL,_const_bool_&,_false>._M_head_impl =
         (_Head_base<2UL,_const_bool_&,_false>)
         &(((object_t *)
           local_50.
           super__Tuple_impl<0UL,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_const_unsigned_long_&,_const_bool_&>
           .
           super__Head_base<0UL,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_false>
           ._M_head_impl)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right;
    bVar12 = inja::std::
             __tuple_compare<std::tuple<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_const_unsigned_long_&,_const_bool_&>,_std::tuple<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_const_unsigned_long_&,_const_bool_&>,_0UL,_3UL>
             ::__eq(&local_38,&local_50);
    goto switchD_001556e5_caseD_0;
  }
  bVar12 = false;
switchD_001556e5_caseD_0:
  return bVar12;
}

Assistant:

constexpr value_t type() const noexcept
    {
        return m_data.m_type;
    }